

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  ReusableStringStream *pRVar2;
  ReusableStringStream local_50;
  string local_38;
  SourceLineInfo *local_18;
  SourceLineInfo *_lineInfo_local;
  string *tag_local;
  
  local_18 = _lineInfo;
  _lineInfo_local = (SourceLineInfo *)tag;
  bVar1 = isReservedTag(tag);
  if (!bVar1) {
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_50);
  pRVar2 = ReusableStringStream::operator<<(&local_50,(char (*) [12])"Tag name: [");
  pRVar2 = ReusableStringStream::operator<<
                     (pRVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             _lineInfo_local);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(char (*) [19])"] is not allowed.\n");
  pRVar2 = ReusableStringStream::operator<<
                     (pRVar2,(char (*) [66])
                             "Tag names starting with non alphanumeric characters are reserved\n");
  pRVar2 = ReusableStringStream::operator<<(pRVar2,local_18);
  ReusableStringStream::str_abi_cxx11_(&local_38,pRVar2);
  throw_domain_error(&local_38);
}

Assistant:

void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
            CATCH_ENFORCE( !isReservedTag(tag),
                          "Tag name: [" << tag << "] is not allowed.\n"
                          << "Tag names starting with non alphanumeric characters are reserved\n"
                          << _lineInfo );
        }